

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

Program __thiscall Inlining::run(Inlining *this,Program *program)

{
  Function *pFVar1;
  Type *pTVar2;
  Function *function;
  mapped_type *pmVar3;
  Function *extraout_RDX;
  Program PVar4;
  Function *main_function;
  FunctionTable function_table;
  Analyze analyze;
  
  pFVar1 = program->first;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  analyze.super_Visitor<void>._vptr_Visitor = (_func_int **)&PTR_visit_int_literal_00155768;
  analyze.function_table = &function_table;
  main_function = pFVar1;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  analyze.function = pFVar1;
  Analyze::evaluate(&analyze,&pFVar1->block);
  function = (Function *)operator_new(0x60);
  pTVar2 = pFVar1->return_type;
  (function->path)._M_dataplus._M_p = (pointer)&(function->path).field_2;
  (function->path)._M_string_length = 0;
  (function->path).field_2._M_local_buf[0] = '\0';
  (function->block).first = (Expression *)0x0;
  (function->block).last = (Expression *)0x0;
  function->arguments = 0;
  (function->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (function->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (function->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  function->return_type = pTVar2;
  function->next_function = (Function *)0x0;
  Program::add_function((Program *)this,function);
  pmVar3 = std::
           map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
           ::operator[](&function_table,&main_function);
  pmVar3->new_function = function;
  Replace::evaluate((Program *)this,&function_table,main_function,&function->block,
                    &main_function->block);
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Inlining::FunctionTableEntry>,_std::_Select1st<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
  ::~_Rb_tree(&function_table._M_t);
  PVar4.last = extraout_RDX;
  PVar4.first = (Function *)this;
  return PVar4;
}

Assistant:

static Program run(const Program& program) {
		const Function* main_function = program.get_main_function();
		Program new_program;
		FunctionTable function_table;
		Analyze analyze(function_table, main_function);
		analyze.evaluate(main_function->get_block());
		Function* new_function = new Function(main_function->get_return_type());
		new_program.add_function(new_function);
		function_table[main_function].new_function = new_function;
		Replace::evaluate(&new_program, function_table, main_function, new_function->get_block(), main_function->get_block());
		return new_program;
	}